

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void mouse_handling::onMouseMove(GLFWwindow *window,double x,double y)

{
  float fVar1;
  float fVar2;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  col_type cVar7;
  int windowH;
  int windowW;
  int local_d8;
  int local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  float local_b8;
  uint uStack_b4;
  int local_a8;
  int iStack_a4;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  row_type local_88;
  mat<4,_4,_float,_(glm::qualifier)0> local_78;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_38;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_34;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_30;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aStack_2c;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_28;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_24;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aStack_20;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_1c;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_18;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  
  uStack_c4 = (uint)((ulong)x >> 0x20);
  if ((pressed == '\0') && (middlePressed == '\0')) {
    local_cc = (float)x;
    local_d0 = (float)y;
  }
  else {
    local_cc = (float)x;
    local_c8 = local_cc - prevX;
    local_d0 = (float)y;
    local_b8 = local_d0 - prevY;
    uStack_c0 = in_XMM0_Dc;
    uStack_bc = in_XMM0_Dd;
    uStack_b4 = uStack_c4;
    glfwGetWindowSize(window,&local_d4,&local_d8);
    if (pressed == '\x01') {
      for (orbitCam.heading = (local_c8 * -3.1415927) / (float)local_d4 + orbitCam.heading;
          orbitCam.heading < 0.0; orbitCam.heading = orbitCam.heading + 6.2831855) {
      }
      for (; 6.2831855 < orbitCam.heading; orbitCam.heading = orbitCam.heading + -6.2831855) {
      }
      fVar2 = (local_b8 * -3.1415927) / (float)local_d8 + orbitCam.pitch;
      fVar1 = -1.4137167;
      if (-1.4137167 <= fVar2) {
        fVar1 = fVar2;
      }
      orbitCam.pitch = 1.4137167;
      if (fVar1 <= 1.4137167) {
        orbitCam.pitch = fVar1;
      }
    }
    if (middlePressed == '\x01') {
      local_c8 = -local_c8;
      uStack_c4 = uStack_c4 ^ 0x80000000;
      uStack_c0 = uStack_c0 ^ 0x80000000;
      uStack_bc = uStack_bc ^ 0x80000000;
      local_98 = ZEXT416((uint)orbitCam.distance);
      local_a8 = local_d4;
      iStack_a4 = local_d8;
      uStack_a0 = 0;
      glm::eulerAngleXY<float>(&local_78,&orbitCam.pitch,&orbitCam.heading);
      local_38 = local_78.value[0].field_0;
      aStack_34 = local_78.value[0].field_1;
      aStack_30 = local_78.value[0].field_2;
      aStack_2c = local_78.value[1].field_0;
      aStack_20 = local_78.value[2].field_0;
      aStack_1c = local_78.value[2].field_1;
      local_28 = local_78.value[1].field_1;
      aStack_24 = local_78.value[1].field_2;
      local_18 = local_78.value[2].field_2;
      auVar4._4_4_ = uStack_c4;
      auVar4._0_4_ = local_c8;
      auVar4._8_4_ = uStack_c4;
      auVar4._12_4_ = uStack_bc;
      auVar3._8_8_ = auVar4._8_8_;
      auVar3._4_4_ = local_b8;
      auVar3._0_4_ = local_c8;
      auVar5._0_12_ = auVar3._0_12_;
      auVar5._12_4_ = uStack_b4;
      auVar6._4_4_ = (float)iStack_a4;
      auVar6._0_4_ = (float)local_a8;
      auVar6._8_4_ = (float)(int)uStack_a0;
      auVar6._12_4_ = (float)uStack_a0._4_4_;
      auVar6 = divps(auVar5,auVar6);
      local_88.field_2.z = (float)local_98._0_4_ * 0.0;
      local_88.field_1.y = (float)local_98._0_4_ * auVar6._4_4_;
      local_88.field_0.x = (float)local_98._0_4_ * auVar6._0_4_;
      cVar7 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)&local_38,&local_88);
      local_78.value[0].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)cVar7.field_2;
      local_78.value[0]._0_8_ = cVar7._0_8_;
      glm::vec<3,float,(glm::qualifier)0>::operator+=
                ((vec<3,float,(glm::qualifier)0> *)&orbitCam,
                 (vec<3,_float,_(glm::qualifier)0> *)&local_78);
    }
  }
  prevX = local_cc;
  prevY = local_d0;
  return;
}

Assistant:

void onMouseMove(GLFWwindow* window, double x, double y)
    {
        if(selectedCamera == -1) // orbit camera is active
        if(pressed || middlePressed)
        {
            const float dx = (float)x - prevX;
            const float dy = (float)y - prevY;
            int windowW, windowH;
            glfwGetWindowSize(window, &windowW, &windowH);
            if(pressed)
            {
                constexpr float speed = PI;
                orbitCam.heading -= speed * dx / windowW;
                while(orbitCam.heading < 0)
                    orbitCam.heading += 2*PI;
                while(orbitCam.heading > 2*PI)
                    orbitCam.heading -= 2*PI;
                orbitCam.pitch -= speed * dy / windowH;
                orbitCam.pitch = glm::clamp(orbitCam.pitch, -0.45f*PI, +0.45f*PI);
            }
            if(middlePressed)
            {
                // center panning
                float speed = orbitCam.distance;
                const vec3 v2d = {-dx/windowW, dy/windowH, 0};
                const glm::mat3 rot = glm::eulerAngleXY(orbitCam.pitch, orbitCam.heading);
                orbitCam.center += rot * (speed * v2d);
            }
        }
        prevX = (float)x;
        prevY = (float)y;
    }